

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O0

void __thiscall
slang::analysis::DataFlowAnalysis::joinState
          (DataFlowAnalysis *this,DataFlowState *result,DataFlowState *other)

{
  size_type sVar1;
  size_type sVar2;
  IntervalMap<unsigned_long,_std::monostate,_3U> *pIVar3;
  reference other_00;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *in_RDX;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *in_RSI;
  allocator_type *in_stack_00000048;
  IntervalMap<unsigned_long,_std::monostate,_3U> *in_stack_00000050;
  IntervalMap<unsigned_long,_std::monostate,_3U> *in_stack_00000058;
  size_t i;
  DataFlowState *in_stack_fffffffffffffeb8;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *in_stack_fffffffffffffec0
  ;
  DataFlowState *this_00;
  IntervalMap<unsigned_long,_std::monostate,_3U> *this_01;
  DataFlowState *in_stack_ffffffffffffff40;
  DataFlowAnalysis *in_stack_ffffffffffffff48;
  IntervalMap<unsigned_long,_std::monostate,_3U> *local_20;
  
  if ((in_RSI[1].firstElement[0x28] & 1U) == (in_RDX[1].firstElement[0x28] & 1U)) {
    sVar1 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::size(in_RSI);
    sVar2 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::size(in_RDX);
    if (sVar2 < sVar1) {
      SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::size(in_RDX);
      SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::resize
                (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
    }
    local_20 = (IntervalMap<unsigned_long,_std::monostate,_3U> *)0x0;
    while (this_01 = local_20,
          pIVar3 = (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                   SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::size
                             (in_RSI), this_01 < pIVar3) {
      other_00 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator[]
                           (in_RSI,(size_type)local_20);
      SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator[]
                (in_RDX,(size_type)local_20);
      IntervalMap<unsigned_long,_std::monostate,_3U>::intersection
                (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator[]
                (in_RSI,(size_type)local_20);
      IntervalMap<unsigned_long,_std::monostate,_3U>::operator=(this_01,other_00);
      local_20 = (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                 ((long)&(local_20->field_0).rootLeaf.
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                         .first[0].left + 1);
    }
  }
  else if ((in_RSI[1].firstElement[0x28] & 1U) == 0) {
    this_00 = (DataFlowState *)&stack0xffffffffffffff00;
    copyState(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    DataFlowState::operator=(this_00,in_stack_fffffffffffffeb8);
    DataFlowState::~DataFlowState((DataFlowState *)0xb04960);
  }
  return;
}

Assistant:

void DataFlowAnalysis::joinState(DataFlowState& result, const DataFlowState& other) {
    if (result.reachable == other.reachable) {
        if (result.assigned.size() > other.assigned.size())
            result.assigned.resize(other.assigned.size());

        for (size_t i = 0; i < result.assigned.size(); i++) {
            result.assigned[i] = result.assigned[i].intersection(other.assigned[i],
                                                                 bitMapAllocator);
        }
    }
    else if (!result.reachable) {
        result = copyState(other);
    }
}